

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::ParseEnumFromString(Parser *this,Type *type,string *result)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  EnumVal *pEVar4;
  EnumDef *pEVar5;
  string *in_RCX;
  string *psVar6;
  long lVar7;
  unsigned_long local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> word;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enum_val_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enum_def_str;
  
  psVar6 = (string *)((result->field_2)._M_allocated_capacity + 0xd0);
  if ((result->field_2)._M_allocated_capacity == 0) {
    psVar6 = result;
  }
  uVar1 = *(uint *)&(psVar6->_M_dataplus)._M_p;
  if (uVar1 - 1 < 10) {
    lVar7 = 0;
    local_b8 = 0;
    do {
      if (lVar7 == -1) {
        if ((uVar1 < 0xb) && ((0x552U >> (uVar1 & 0x1f) & 1) != 0)) {
          NumToString<unsigned_long>(&word,local_b8);
        }
        else {
          NumToString<long>(&word,local_b8);
        }
        std::__cxx11::string::operator=(in_RCX,(string *)&word);
        std::__cxx11::string::~string((string *)&word);
        *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
        break;
      }
      lVar3 = std::__cxx11::string::find((char)&type[1].struct_def,0x20);
      lVar7 = lVar3 + 1;
      if (lVar3 + 1 == 0) {
        lVar7 = -1;
      }
      std::__cxx11::string::substr((ulong)&word,(ulong)&type[1].struct_def);
      if ((result->field_2)._M_allocated_capacity == 0) {
        lVar3 = std::__cxx11::string::find((char)&word,0x2e);
        if (lVar3 == -1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&enum_def_str,"enum values need to be qualified by an enum type",
                     (allocator<char> *)&enum_val_str);
          Error(this,(string *)type);
          goto LAB_0011e67f;
        }
        std::__cxx11::string::substr((ulong)&enum_def_str,(ulong)&word);
        pEVar5 = LookupEnum((Parser *)type,&enum_def_str);
        if (pEVar5 == (EnumDef *)0x0) {
          std::operator+(&enum_val_str,"unknown enum: ",&enum_def_str);
          Error(this,(string *)type);
          std::__cxx11::string::~string((string *)&enum_val_str);
          pEVar4 = (EnumVal *)0x0;
        }
        else {
          std::__cxx11::string::substr((ulong)&enum_val_str,(ulong)&word);
          pEVar4 = SymbolTable<flatbuffers::EnumVal>::Lookup(&pEVar5->vals,&enum_val_str);
          std::__cxx11::string::~string((string *)&enum_val_str);
        }
        std::__cxx11::string::~string((string *)&enum_def_str);
        if (pEVar5 != (EnumDef *)0x0) goto LAB_0011e58f;
LAB_0011e687:
        bVar2 = false;
      }
      else {
        pEVar4 = SymbolTable<flatbuffers::EnumVal>::Lookup
                           ((SymbolTable<flatbuffers::EnumVal> *)
                            ((result->field_2)._M_allocated_capacity + 0xf0),&word);
LAB_0011e58f:
        if (pEVar4 == (EnumVal *)0x0) {
          std::operator+(&enum_def_str,"unknown enum value: ",&word);
          Error(this,(string *)type);
LAB_0011e67f:
          std::__cxx11::string::~string((string *)&enum_def_str);
          goto LAB_0011e687;
        }
        local_b8 = local_b8 | pEVar4->value;
        bVar2 = true;
      }
      std::__cxx11::string::~string((string *)&word);
    } while (bVar2);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&word,"not a valid value for this field",(allocator<char> *)&enum_def_str);
    Error(this,(string *)type);
    std::__cxx11::string::~string((string *)&word);
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseEnumFromString(const Type &type,
                                         std::string *result) {
  const auto base_type =
      type.enum_def ? type.enum_def->underlying_type.base_type : type.base_type;
  if (!IsInteger(base_type)) return Error("not a valid value for this field");
  uint64_t u64 = 0;
  for (size_t pos = 0; pos != std::string::npos;) {
    const auto delim = attribute_.find_first_of(' ', pos);
    const auto last = (std::string::npos == delim);
    auto word = attribute_.substr(pos, !last ? delim - pos : std::string::npos);
    pos = !last ? delim + 1 : std::string::npos;
    const EnumVal *ev = nullptr;
    if (type.enum_def) {
      ev = type.enum_def->Lookup(word);
    } else {
      auto dot = word.find_first_of('.');
      if (std::string::npos == dot)
        return Error("enum values need to be qualified by an enum type");
      auto enum_def_str = word.substr(0, dot);
      const auto enum_def = LookupEnum(enum_def_str);
      if (!enum_def) return Error("unknown enum: " + enum_def_str);
      auto enum_val_str = word.substr(dot + 1);
      ev = enum_def->Lookup(enum_val_str);
    }
    if (!ev) return Error("unknown enum value: " + word);
    u64 |= ev->GetAsUInt64();
  }
  *result = IsUnsigned(base_type) ? NumToString(u64)
                                  : NumToString(static_cast<int64_t>(u64));
  return NoError();
}